

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FalseTests.cpp
# Opt level: O0

void __thiscall IsFalseTests::Run(IsFalseTests *this)

{
  anon_class_1_0_00000001 local_299;
  function<void_()> local_298;
  allocator local_271;
  string local_270 [39];
  anon_class_1_0_00000001 local_249;
  function<void_()> local_248;
  allocator local_221;
  string local_220 [39];
  anon_class_1_0_00000001 local_1f9;
  function<void_()> local_1f8;
  allocator local_1d1;
  string local_1d0 [39];
  anon_class_1_0_00000001 local_1a9;
  function<void_()> local_1a8;
  allocator local_181;
  string local_180 [39];
  anon_class_1_0_00000001 local_159;
  function<void_()> local_158;
  allocator local_131;
  string local_130 [39];
  anon_class_1_0_00000001 local_109;
  function<void_()> local_108;
  allocator local_e1;
  string local_e0 [39];
  anon_class_1_0_00000001 local_b9;
  function<void_()> local_b8;
  allocator local_91;
  string local_90 [39];
  anon_class_1_0_00000001 local_69;
  function<void_()> local_68;
  allocator local_31;
  string local_30 [32];
  IsFalseTests *local_10;
  IsFalseTests *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Is::False(false) is true",&local_31);
  std::function<void()>::function<IsFalseTests::Run()::_lambda()_1_,void>
            ((function<void()> *)&local_68,&local_69);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_30,&local_68);
  std::function<void_()>::~function(&local_68);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"Is::False(true) is not true",&local_91);
  std::function<void()>::function<IsFalseTests::Run()::_lambda()_2_,void>
            ((function<void()> *)&local_b8,&local_b9);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_90,&local_b8);
  std::function<void_()>::~function(&local_b8);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"Is::False has an error message",&local_e1);
  std::function<void()>::function<IsFalseTests::Run()::_lambda()_3_,void>
            ((function<void()> *)&local_108,&local_109);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_e0,&local_108);
  std::function<void_()>::~function(&local_108);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"Is::Not::False(true) is true",&local_131);
  std::function<void()>::function<IsFalseTests::Run()::_lambda()_4_,void>
            ((function<void()> *)&local_158,&local_159);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_130,&local_158);
  std::function<void_()>::~function(&local_158);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"Is::Not::False(false) is not true",&local_181);
  std::function<void()>::function<IsFalseTests::Run()::_lambda()_5_,void>
            ((function<void()> *)&local_1a8,&local_1a9);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_180,&local_1a8);
  std::function<void_()>::~function(&local_1a8);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"Is::False returns an Operand",&local_1d1);
  std::function<void()>::function<IsFalseTests::Run()::_lambda()_6_,void>
            ((function<void()> *)&local_1f8,&local_1f9);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_1d0,&local_1f8);
  std::function<void_()>::~function(&local_1f8);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"Is::Not::False returns an Operand",&local_221);
  std::function<void()>::function<IsFalseTests::Run()::_lambda()_7_,void>
            ((function<void()> *)&local_248,&local_249);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_220,&local_248);
  std::function<void_()>::~function(&local_248);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"Is::Not::False has an error message",&local_271);
  std::function<void()>::function<IsFalseTests::Run()::_lambda()_8_,void>
            ((function<void()> *)&local_298,&local_299);
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,local_270,&local_298);
  std::function<void_()>::~function(&local_298);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  return;
}

Assistant:

virtual void Run()
	{
		Then("Is::False(false) is true", []() {
			AssertThat(ut11::Is::False(false), ut11::Is::True);
		});

		Then("Is::False(true) is not true", []() {
			AssertThat(ut11::Is::False(true), ut11::Is::Not::True);
		});

		Then("Is::False has an error message", []() {
			AssertThat(ut11::Is::False.GetErrorMessage(true), ut11::Is::Not::EqualTo(""));
		});

		Then("Is::Not::False(true) is true", []() {
			AssertThat(ut11::Is::Not::False(true), ut11::Is::True);
		});

		Then("Is::Not::False(false) is not true", []() {
			AssertThat(ut11::Is::Not::False(false), ut11::Is::Not::True);
		});

		Then("Is::False returns an Operand", []() {
			AssertThat( ut11::detail::IsOperand<decltype(ut11::Is::False)>::value, ut11::Is::True );
		});

		Then("Is::Not::False returns an Operand", []() {
			AssertThat( ut11::detail::IsOperand<decltype(ut11::Is::Not::False)>::value, ut11::Is::True );
		});

		Then("Is::Not::False has an error message", []() {
			AssertThat(ut11::Is::Not::False.GetErrorMessage(false), ut11::Is::Not::EqualTo(""));
		});
	}